

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O0

LY_ERR lyd_validate_minmax(lyd_node *first,lyd_node *parent,lysc_node *snode,uint32_t min,
                          uint32_t max,uint32_t val_opts)

{
  LY_ERR LVar1;
  lysc_when *plVar2;
  bool bVar3;
  lysc_when *plStack_48;
  LY_ERR ret__;
  lysc_when *disabled;
  lyd_node *iter;
  uint32_t count;
  uint32_t val_opts_local;
  uint32_t max_local;
  uint32_t min_local;
  lysc_node *snode_local;
  lyd_node *parent_local;
  lyd_node *first_local;
  
  iter._0_4_ = 0;
  iter._4_4_ = val_opts;
  count = max;
  val_opts_local = min;
  _max_local = snode;
  snode_local = (lysc_node *)parent;
  parent_local = first;
  if ((min == 0) && (max == 0)) {
    __assert_fail("min || max",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/validation.c"
                  ,0x47b,
                  "LY_ERR lyd_validate_minmax(const struct lyd_node *, const struct lyd_node *, const struct lysc_node *, uint32_t, uint32_t, uint32_t)"
                 );
  }
  lyd_find_sibling_val(first,snode,(char *)0x0,0,(lyd_node **)&disabled);
  while( true ) {
    bVar3 = false;
    if (disabled != (lysc_when *)0x0) {
      bVar3 = disabled->context == _max_local;
    }
    if ((!bVar3) ||
       ((((iter._0_4_ = (uint)iter + 1, val_opts_local != 0 && ((uint)iter == val_opts_local)) &&
         (val_opts_local = 0, count == 0)) || ((count != 0 && (count < (uint)iter)))))) break;
    disabled = (lysc_when *)disabled->dsc;
  }
  if (val_opts_local != 0) {
    if (val_opts_local <= (uint)iter) {
      __assert_fail("count < min",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/validation.c"
                    ,0x48f,
                    "LY_ERR lyd_validate_minmax(const struct lyd_node *, const struct lyd_node *, const struct lysc_node *, uint32_t, uint32_t, uint32_t)"
                   );
    }
    plStack_48 = (lysc_when *)0x0;
    plVar2 = lysc_has_when(_max_local);
    if ((plVar2 != (lysc_when *)0x0) &&
       (LVar1 = lyd_validate_dummy_when
                          (parent_local,(lyd_node *)snode_local,_max_local,&stack0xffffffffffffffb8)
       , LVar1 != LY_SUCCESS)) {
      return LVar1;
    }
    if (plStack_48 != (lysc_when *)0x0) {
      val_opts_local = 0;
    }
  }
  if ((count != 0) && ((uint)iter <= count)) {
    count = 0;
  }
  if (val_opts_local == 0) {
    if (count != 0) {
      if ((iter._4_4_ & 8) == 0) {
        ly_log_location((lysc_node *)0x0,(lyd_node *)disabled,(char *)0x0,(ly_in *)0x0);
        ly_vlog(_max_local->module->ctx,"too-many-elements",LYVE_DATA,"Too many \"%s\" instances.",
                _max_local->name);
        ly_log_location_revert(0,1,0,0);
        return LY_EVALID;
      }
      ly_log_location((lysc_node *)0x0,(lyd_node *)disabled,(char *)0x0,(ly_in *)0x0);
      ly_log(_max_local->module->ctx,LY_LLWRN,LY_SUCCESS,"Too many \"%s\" instances.",
             _max_local->name);
      ly_log_location_revert(0,1,0,0);
    }
  }
  else {
    if ((iter._4_4_ & 8) == 0) {
      ly_log_location(_max_local,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
      ly_vlog(_max_local->module->ctx,"too-few-elements",LYVE_DATA,"Too few \"%s\" instances.",
              _max_local->name);
      ly_log_location_revert(1,0,0,0);
      return LY_EVALID;
    }
    ly_log_location(_max_local,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
    ly_log(_max_local->module->ctx,LY_LLWRN,LY_SUCCESS,"Too few \"%s\" instances.",_max_local->name)
    ;
    ly_log_location_revert(1,0,0,0);
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
lyd_validate_minmax(const struct lyd_node *first, const struct lyd_node *parent, const struct lysc_node *snode,
        uint32_t min, uint32_t max, uint32_t val_opts)
{
    uint32_t count = 0;
    struct lyd_node *iter;
    const struct lysc_when *disabled;

    assert(min || max);

    LYD_LIST_FOR_INST(first, snode, iter) {
        ++count;

        if (min && (count == min)) {
            /* satisfied */
            min = 0;
            if (!max) {
                /* nothing more to check */
                break;
            }
        }
        if (max && (count > max)) {
            /* not satisifed */
            break;
        }
    }

    if (min) {
        assert(count < min);

        disabled = NULL;
        if (lysc_has_when(snode)) {
            /* if there are any when conditions, they must be true for a validation error */
            LY_CHECK_RET(lyd_validate_dummy_when(first, parent, snode, &disabled));
        }

        if (disabled) {
            /* satisfied */
            min = 0;
        }
    }
    if (max && (count <= max)) {
        /* satisfied */
        max = 0;
    }

    if (min) {
        if (val_opts & LYD_VALIDATE_OPERATIONAL) {
            /* only a warning */
            LOG_LOCSET(snode, NULL);
            LOGWRN(snode->module->ctx, "Too few \"%s\" instances.", snode->name);
            LOG_LOCBACK(1, 0);
        } else {
            LOG_LOCSET(snode, NULL);
            LOGVAL_APPTAG(snode->module->ctx, "too-few-elements", LY_VCODE_NOMIN, snode->name);
            LOG_LOCBACK(1, 0);
            return LY_EVALID;
        }
    } else if (max) {
        if (val_opts & LYD_VALIDATE_OPERATIONAL) {
            /* only a warning */
            LOG_LOCSET(NULL, iter);
            LOGWRN(snode->module->ctx, "Too many \"%s\" instances.", snode->name);
            LOG_LOCBACK(0, 1);
        } else {
            LOG_LOCSET(NULL, iter);
            LOGVAL_APPTAG(snode->module->ctx, "too-many-elements", LY_VCODE_NOMAX, snode->name);
            LOG_LOCBACK(0, 1);
            return LY_EVALID;
        }
    }
    return LY_SUCCESS;
}